

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  vfloat<4> vVar3;
  BVH *bvh;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [12];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  uint uVar31;
  undefined4 uVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  NodeRef root;
  size_t sVar38;
  size_t sVar39;
  uint uVar40;
  NodeRef *pNVar41;
  ulong uVar42;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar64;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  undefined1 auVar113 [48];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar157 [16];
  undefined1 auVar163 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar164;
  float fVar171;
  undefined1 auVar167 [16];
  float fVar169;
  float fVar170;
  undefined1 auVar168 [64];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [64];
  float fVar175;
  float fVar177;
  float fVar178;
  undefined1 auVar176 [16];
  float fVar179;
  Precalculations pre;
  float local_38c8;
  float fStack_38c4;
  float fStack_38c0;
  undefined1 local_3898 [16];
  undefined1 local_3858 [16];
  RayK<4> *local_3840;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_37f8 [16];
  undefined1 local_37e8 [16];
  undefined8 local_3708;
  undefined8 uStack_3700;
  RTCHitN local_36f8 [16];
  undefined1 local_36e8 [16];
  undefined1 local_36d8 [16];
  undefined1 local_36c8 [16];
  undefined1 local_36b8 [16];
  undefined1 local_36a8 [16];
  uint local_3698;
  uint uStack_3694;
  uint uStack_3690;
  uint uStack_368c;
  uint local_3688;
  uint uStack_3684;
  uint uStack_3680;
  uint uStack_367c;
  uint uStack_3678;
  uint uStack_3674;
  uint uStack_3670;
  uint uStack_366c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  uVar30 = mm_lookupmask_ps._248_8_;
  uVar29 = mm_lookupmask_ps._240_8_;
  uVar28 = mm_lookupmask_ps._8_8_;
  uVar27 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar72 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar63 = vpcmpeqd_avx(auVar72,(undefined1  [16])valid_i->field_0);
    auVar73 = ZEXT816(0) << 0x40;
    auVar10 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar73,5);
    auVar84 = auVar63 & auVar10;
    if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar84[0xf] < '\0')
    {
      auVar10 = vandps_avx(auVar10,auVar63);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar156._8_4_ = 0x7fffffff;
      auVar156._0_8_ = 0x7fffffff7fffffff;
      auVar156._12_4_ = 0x7fffffff;
      auVar63 = vandps_avx(auVar156,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar147._8_4_ = 0x219392ef;
      auVar147._0_8_ = 0x219392ef219392ef;
      auVar147._12_4_ = 0x219392ef;
      auVar84 = vcmpps_avx(auVar63,auVar147,1);
      auVar157._8_4_ = 0x3f800000;
      auVar157._0_8_ = 0x3f8000003f800000;
      auVar157._12_4_ = 0x3f800000;
      auVar77 = vdivps_avx(auVar157,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar63 = vandps_avx(auVar156,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar128 = vcmpps_avx(auVar63,auVar147,1);
      auVar78 = vdivps_avx(auVar157,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar63 = vandps_avx(auVar156,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar63 = vcmpps_avx(auVar63,auVar147,1);
      auVar85 = vdivps_avx(auVar157,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar148._8_4_ = 0x5d5e0b6b;
      auVar148._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar148._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar77,auVar148,auVar84);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar78,auVar148,auVar128)
      ;
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar85,auVar148,auVar63);
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar73,1);
      auVar77._8_4_ = 0x20;
      auVar77._0_8_ = 0x2000000020;
      auVar77._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar63,auVar77);
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar73,5);
      auVar84._8_4_ = 0x40;
      auVar84._0_8_ = 0x4000000040;
      auVar84._12_4_ = 0x40;
      auVar78._8_4_ = 0x60;
      auVar78._0_8_ = 0x6000000060;
      auVar78._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar78,auVar84,auVar63);
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar73,5);
      auVar128._8_4_ = 0x80;
      auVar128._0_8_ = 0x8000000080;
      auVar128._12_4_ = 0x80;
      auVar85._8_4_ = 0xa0;
      auVar85._0_8_ = 0xa0000000a0;
      auVar85._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar85,auVar128,auVar63)
      ;
      auVar63 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar73);
      auVar84 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar73);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar163 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar63,auVar10);
      auVar63._8_4_ = 0xff800000;
      auVar63._0_8_ = 0xff800000ff800000;
      auVar63._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar63,auVar84,auVar10);
      auVar112 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
      terminated.field_0.i[1] = auVar10._4_4_ ^ auVar72._4_4_;
      terminated.field_0.i[0] = auVar10._0_4_ ^ auVar72._0_4_;
      terminated.field_0.i[2] = auVar10._8_4_ ^ auVar72._8_4_;
      terminated.field_0.i[3] = auVar10._12_4_ ^ auVar72._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar40 = 3;
      }
      else {
        uVar40 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_3840 = ray + 0x80;
      pNVar41 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar43 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_005ab8be:
      do {
        do {
          root.ptr = pNVar41[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_005acbd9;
          pNVar41 = pNVar41 + -1;
          paVar43 = paVar43 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar43->v;
          auVar89 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar72 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar31 = vmovmskps_avx(auVar72);
        } while (uVar31 == 0);
        uVar42 = (ulong)(byte)uVar31;
        if (uVar40 < (uint)POPCOUNT(uVar31 & 0xff)) {
LAB_005ab8fe:
          do {
            iVar33 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005acbd9;
              auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar89._0_16_,6);
              if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar72[0xf]) goto LAB_005ab8be;
              uVar42 = (ulong)((uint)root.ptr & 0xf);
              if (uVar42 == 8) {
                auVar72 = vpcmpeqd_avx(auVar112._0_16_,auVar112._0_16_);
                aVar64 = terminated.field_0;
                goto LAB_005acac5;
              }
              auVar73._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar73._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar73._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar36 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar35 = 0;
              goto LAB_005abaed;
            }
            lVar36 = 0;
            sVar39 = 8;
            auVar72 = auVar163._0_16_;
            do {
              sVar38 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar36 * 8);
              if (sVar38 == 8) {
                auVar89 = ZEXT1664(auVar72);
                sVar38 = sVar39;
                break;
              }
              uVar32 = *(undefined4 *)(root.ptr + 0x40 + lVar36 * 4);
              auVar65._4_4_ = uVar32;
              auVar65._0_4_ = uVar32;
              auVar65._8_4_ = uVar32;
              auVar65._12_4_ = uVar32;
              auVar20._8_8_ = tray.org.field_0._8_8_;
              auVar20._0_8_ = tray.org.field_0._0_8_;
              auVar21._8_8_ = tray.org.field_0._24_8_;
              auVar21._0_8_ = tray.org.field_0._16_8_;
              auVar22._8_8_ = tray.org.field_0._40_8_;
              auVar22._0_8_ = tray.org.field_0._32_8_;
              auVar63 = vsubps_avx(auVar65,auVar20);
              auVar131._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar63._0_4_;
              auVar131._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar63._4_4_;
              auVar131._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar63._8_4_;
              auVar131._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar63._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x80 + lVar36 * 4);
              auVar66._4_4_ = uVar32;
              auVar66._0_4_ = uVar32;
              auVar66._8_4_ = uVar32;
              auVar66._12_4_ = uVar32;
              auVar63 = vsubps_avx(auVar66,auVar21);
              auVar141._0_4_ = tray.rdir.field_0._16_4_ * auVar63._0_4_;
              auVar141._4_4_ = tray.rdir.field_0._20_4_ * auVar63._4_4_;
              auVar141._8_4_ = tray.rdir.field_0._24_4_ * auVar63._8_4_;
              auVar141._12_4_ = tray.rdir.field_0._28_4_ * auVar63._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0xc0 + lVar36 * 4);
              auVar67._4_4_ = uVar32;
              auVar67._0_4_ = uVar32;
              auVar67._8_4_ = uVar32;
              auVar67._12_4_ = uVar32;
              auVar63 = vsubps_avx(auVar67,auVar22);
              auVar152._0_4_ = tray.rdir.field_0._32_4_ * auVar63._0_4_;
              auVar152._4_4_ = tray.rdir.field_0._36_4_ * auVar63._4_4_;
              auVar152._8_4_ = tray.rdir.field_0._40_4_ * auVar63._8_4_;
              auVar152._12_4_ = tray.rdir.field_0._44_4_ * auVar63._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0x60 + lVar36 * 4);
              auVar68._4_4_ = uVar32;
              auVar68._0_4_ = uVar32;
              auVar68._8_4_ = uVar32;
              auVar68._12_4_ = uVar32;
              auVar63 = vsubps_avx(auVar68,auVar20);
              auVar90._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar63._0_4_;
              auVar90._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar63._4_4_;
              auVar90._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar63._8_4_;
              auVar90._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar63._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0xa0 + lVar36 * 4);
              auVar69._4_4_ = uVar32;
              auVar69._0_4_ = uVar32;
              auVar69._8_4_ = uVar32;
              auVar69._12_4_ = uVar32;
              auVar63 = vsubps_avx(auVar69,auVar21);
              auVar114._0_4_ = tray.rdir.field_0._16_4_ * auVar63._0_4_;
              auVar114._4_4_ = tray.rdir.field_0._20_4_ * auVar63._4_4_;
              auVar114._8_4_ = tray.rdir.field_0._24_4_ * auVar63._8_4_;
              auVar114._12_4_ = tray.rdir.field_0._28_4_ * auVar63._12_4_;
              uVar32 = *(undefined4 *)(root.ptr + 0xe0 + lVar36 * 4);
              auVar70._4_4_ = uVar32;
              auVar70._0_4_ = uVar32;
              auVar70._8_4_ = uVar32;
              auVar70._12_4_ = uVar32;
              auVar63 = vsubps_avx(auVar70,auVar22);
              auVar125._0_4_ = tray.rdir.field_0._32_4_ * auVar63._0_4_;
              auVar125._4_4_ = tray.rdir.field_0._36_4_ * auVar63._4_4_;
              auVar125._8_4_ = tray.rdir.field_0._40_4_ * auVar63._8_4_;
              auVar125._12_4_ = tray.rdir.field_0._44_4_ * auVar63._12_4_;
              auVar63 = vminps_avx(auVar131,auVar90);
              auVar84 = vminps_avx(auVar141,auVar114);
              auVar63 = vmaxps_avx(auVar63,auVar84);
              auVar84 = vminps_avx(auVar152,auVar125);
              auVar63 = vmaxps_avx(auVar63,auVar84);
              auVar71._0_4_ = auVar168._0_4_ * auVar63._0_4_;
              auVar71._4_4_ = auVar168._4_4_ * auVar63._4_4_;
              auVar71._8_4_ = auVar168._8_4_ * auVar63._8_4_;
              auVar71._12_4_ = auVar168._12_4_ * auVar63._12_4_;
              auVar63 = vmaxps_avx(auVar131,auVar90);
              auVar84 = vmaxps_avx(auVar141,auVar114);
              auVar84 = vminps_avx(auVar63,auVar84);
              auVar63 = vmaxps_avx(auVar152,auVar125);
              auVar63 = vminps_avx(auVar84,auVar63);
              auVar91._0_4_ = auVar174._0_4_ * auVar63._0_4_;
              auVar91._4_4_ = auVar174._4_4_ * auVar63._4_4_;
              auVar91._8_4_ = auVar174._8_4_ * auVar63._8_4_;
              auVar91._12_4_ = auVar174._12_4_ * auVar63._12_4_;
              auVar63 = vmaxps_avx(auVar71,(undefined1  [16])tray.tnear.field_0);
              auVar84 = vminps_avx(auVar91,(undefined1  [16])tray.tfar.field_0);
              auVar63 = vcmpps_avx(auVar63,auVar84,2);
              auVar112 = ZEXT1664(auVar63);
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar63[0xf]) {
                auVar89 = ZEXT1664(auVar72);
                sVar38 = sVar39;
              }
              else {
                auVar63 = vblendvps_avx(auVar163._0_16_,auVar71,auVar63);
                auVar89 = ZEXT1664(auVar63);
                if (sVar39 != 8) {
                  pNVar41->ptr = sVar39;
                  pNVar41 = pNVar41 + 1;
                  *(undefined1 (*) [16])paVar43->v = auVar72;
                  paVar43 = paVar43 + 1;
                }
              }
              lVar36 = lVar36 + 1;
              auVar72 = auVar89._0_16_;
              sVar39 = sVar38;
            } while (lVar36 != 8);
            if (sVar38 == 8) goto LAB_005aba8f;
            auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar89._0_16_,6);
            uVar32 = vmovmskps_avx(auVar72);
            root.ptr = sVar38;
          } while ((byte)uVar40 < (byte)POPCOUNT(uVar32));
          pNVar41->ptr = sVar38;
          pNVar41 = pNVar41 + 1;
          *paVar43 = auVar89._0_16_;
          paVar43 = paVar43 + 1;
        }
        else {
          do {
            sVar39 = 0;
            for (uVar35 = uVar42; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
              sVar39 = sVar39 + 1;
            }
            auVar112 = ZEXT1664(auVar112._0_16_);
            bVar44 = occluded1(This,bvh,root,sVar39,&pre,ray,&tray,context);
            if (bVar44) {
              terminated.field_0.i[sVar39] = -1;
            }
            uVar42 = uVar42 - 1 & uVar42;
          } while (uVar42 != 0);
          auVar72 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar33 = 3;
          if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar72[0xf] < '\0') {
            auVar72._8_4_ = 0xff800000;
            auVar72._0_8_ = 0xff800000ff800000;
            auVar72._12_4_ = 0xff800000;
            auVar112 = ZEXT1664(auVar72);
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar72,
                               (undefined1  [16])terminated.field_0);
            iVar33 = 2;
          }
          auVar163 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar89 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if (uVar40 < (uint)POPCOUNT(uVar31 & 0xff)) goto LAB_005ab8fe;
        }
LAB_005aba8f:
      } while (iVar33 != 3);
LAB_005acbd9:
      auVar10 = vandps_avx(auVar10,(undefined1  [16])terminated.field_0);
      auVar88._8_4_ = 0xff800000;
      auVar88._0_8_ = 0xff800000ff800000;
      auVar88._12_4_ = 0xff800000;
      auVar10 = vmaskmovps_avx(auVar10,auVar88);
      *(undefined1 (*) [16])local_3840 = auVar10;
    }
  }
  return;
  while( true ) {
    uVar35 = uVar35 + 1;
    lVar36 = lVar36 + 0xe0;
    auVar73 = auVar63;
    if (uVar42 - 8 <= uVar35) break;
LAB_005abaed:
    lVar34 = uVar35 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    uVar37 = 0;
    auVar72 = auVar73;
    while( true ) {
      uVar31 = *(uint *)(lVar36 + uVar37 * 4);
      if ((ulong)uVar31 == 0xffffffff) break;
      uVar32 = *(undefined4 *)(lVar36 + -0xc0 + uVar37 * 4);
      auVar45._4_4_ = uVar32;
      auVar45._0_4_ = uVar32;
      auVar45._8_4_ = uVar32;
      auVar45._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar36 + -0xb0 + uVar37 * 4);
      auVar92._4_4_ = uVar32;
      auVar92._0_4_ = uVar32;
      auVar92._8_4_ = uVar32;
      auVar92._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar36 + -0xa0 + uVar37 * 4);
      auVar165._4_4_ = uVar32;
      auVar165._0_4_ = uVar32;
      auVar165._8_4_ = uVar32;
      auVar165._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar36 + -0x90 + uVar37 * 4);
      auVar129._4_4_ = uVar32;
      auVar129._0_4_ = uVar32;
      auVar129._8_4_ = uVar32;
      auVar129._12_4_ = uVar32;
      local_3898._4_4_ = *(undefined4 *)(lVar36 + -0x80 + uVar37 * 4);
      local_3898._0_4_ = local_3898._4_4_;
      local_3898._8_4_ = local_3898._4_4_;
      local_3898._12_4_ = local_3898._4_4_;
      uVar32 = *(undefined4 *)(lVar36 + -0x70 + uVar37 * 4);
      auVar176._4_4_ = uVar32;
      auVar176._0_4_ = uVar32;
      auVar176._8_4_ = uVar32;
      auVar176._12_4_ = uVar32;
      local_37e8._4_4_ = *(undefined4 *)(lVar36 + -0x60 + uVar37 * 4);
      local_37e8._0_4_ = local_37e8._4_4_;
      local_37e8._8_4_ = local_37e8._4_4_;
      local_37e8._12_4_ = local_37e8._4_4_;
      local_37f8._4_4_ = *(undefined4 *)(lVar36 + -0x50 + uVar37 * 4);
      local_37f8._0_4_ = local_37f8._4_4_;
      local_37f8._8_4_ = local_37f8._4_4_;
      local_37f8._12_4_ = local_37f8._4_4_;
      uVar32 = *(undefined4 *)(lVar36 + -0x40 + uVar37 * 4);
      uVar1 = *(undefined4 *)(lVar36 + -0x30 + uVar37 * 4);
      auVar142._4_4_ = uVar1;
      auVar142._0_4_ = uVar1;
      auVar142._8_4_ = uVar1;
      auVar142._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar36 + -0x20 + uVar37 * 4);
      auVar153._4_4_ = uVar1;
      auVar153._0_4_ = uVar1;
      auVar153._8_4_ = uVar1;
      auVar153._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar36 + -0x10 + uVar37 * 4);
      auVar158._4_4_ = uVar1;
      auVar158._0_4_ = uVar1;
      auVar158._8_4_ = uVar1;
      auVar158._12_4_ = uVar1;
      local_3708 = *(undefined8 *)(lVar34 + 0xd0);
      uStack_3700 = *(undefined8 *)(lVar34 + 0xd8);
      auVar63 = *(undefined1 (*) [16])ray;
      auVar84 = *(undefined1 (*) [16])(ray + 0x10);
      auVar128 = *(undefined1 (*) [16])(ray + 0x20);
      auVar85 = vsubps_avx(auVar45,auVar63);
      auVar147 = vsubps_avx(auVar92,auVar84);
      auVar148 = vsubps_avx(auVar165,auVar128);
      auVar157 = vsubps_avx(auVar153,auVar84);
      auVar45 = vsubps_avx(auVar158,auVar128);
      auVar92 = vsubps_avx(auVar157,auVar147);
      auVar165 = vsubps_avx(auVar45,auVar148);
      auVar154._0_4_ = auVar157._0_4_ + auVar147._0_4_;
      auVar154._4_4_ = auVar157._4_4_ + auVar147._4_4_;
      auVar154._8_4_ = auVar157._8_4_ + auVar147._8_4_;
      auVar154._12_4_ = auVar157._12_4_ + auVar147._12_4_;
      fVar6 = auVar148._0_4_;
      auVar159._0_4_ = auVar45._0_4_ + fVar6;
      fVar7 = auVar148._4_4_;
      auVar159._4_4_ = auVar45._4_4_ + fVar7;
      fVar8 = auVar148._8_4_;
      auVar159._8_4_ = auVar45._8_4_ + fVar8;
      fVar9 = auVar148._12_4_;
      auVar159._12_4_ = auVar45._12_4_ + fVar9;
      auVar166._0_4_ = auVar154._0_4_ * auVar165._0_4_;
      auVar166._4_4_ = auVar154._4_4_ * auVar165._4_4_;
      auVar166._8_4_ = auVar154._8_4_ * auVar165._8_4_;
      auVar166._12_4_ = auVar154._12_4_ * auVar165._12_4_;
      auVar130 = vfmsub231ps_fma(auVar166,auVar92,auVar159);
      auVar166 = vsubps_avx(auVar142,auVar63);
      auVar51 = vsubps_avx(auVar166,auVar85);
      auVar160._0_4_ = auVar159._0_4_ * auVar51._0_4_;
      auVar160._4_4_ = auVar159._4_4_ * auVar51._4_4_;
      auVar160._8_4_ = auVar159._8_4_ * auVar51._8_4_;
      auVar160._12_4_ = auVar159._12_4_ * auVar51._12_4_;
      auVar172._0_4_ = auVar166._0_4_ + auVar85._0_4_;
      auVar172._4_4_ = auVar166._4_4_ + auVar85._4_4_;
      auVar172._8_4_ = auVar166._8_4_ + auVar85._8_4_;
      auVar172._12_4_ = auVar166._12_4_ + auVar85._12_4_;
      auVar78 = vfmsub231ps_fma(auVar160,auVar165,auVar172);
      auVar173._0_4_ = auVar172._0_4_ * auVar92._0_4_;
      auVar173._4_4_ = auVar172._4_4_ * auVar92._4_4_;
      auVar173._8_4_ = auVar172._8_4_ * auVar92._8_4_;
      auVar173._12_4_ = auVar172._12_4_ * auVar92._12_4_;
      auVar77 = vfmsub231ps_fma(auVar173,auVar51,auVar154);
      fVar14 = *(float *)(ray + 0x60);
      fVar16 = *(float *)(ray + 100);
      fVar17 = *(float *)(ray + 0x68);
      auVar26 = *(undefined1 (*) [12])(ray + 0x60);
      fVar18 = *(float *)(ray + 0x6c);
      auVar143._0_4_ = auVar77._0_4_ * fVar14;
      auVar143._4_4_ = auVar77._4_4_ * fVar16;
      auVar143._8_4_ = auVar77._8_4_ * fVar17;
      auVar143._12_4_ = auVar77._12_4_ * fVar18;
      auVar77 = *(undefined1 (*) [16])(ray + 0x50);
      auVar143 = vfmadd231ps_fma(auVar143,auVar77,auVar78);
      auVar78 = *(undefined1 (*) [16])(ray + 0x40);
      auVar154 = vfmadd231ps_fma(auVar143,auVar78,auVar130);
      auVar63 = vsubps_avx(auVar129,auVar63);
      auVar84 = vsubps_avx(local_3898,auVar84);
      auVar128 = vsubps_avx(auVar176,auVar128);
      auVar143 = vsubps_avx(auVar147,auVar84);
      auVar148 = vsubps_avx(auVar148,auVar128);
      auVar132._0_4_ = auVar147._0_4_ + auVar84._0_4_;
      auVar132._4_4_ = auVar147._4_4_ + auVar84._4_4_;
      auVar132._8_4_ = auVar147._8_4_ + auVar84._8_4_;
      auVar132._12_4_ = auVar147._12_4_ + auVar84._12_4_;
      auVar149._0_4_ = fVar6 + auVar128._0_4_;
      auVar149._4_4_ = fVar7 + auVar128._4_4_;
      auVar149._8_4_ = fVar8 + auVar128._8_4_;
      auVar149._12_4_ = fVar9 + auVar128._12_4_;
      fVar175 = auVar148._0_4_;
      auVar130._0_4_ = fVar175 * auVar132._0_4_;
      fVar177 = auVar148._4_4_;
      auVar130._4_4_ = fVar177 * auVar132._4_4_;
      fVar178 = auVar148._8_4_;
      auVar130._8_4_ = fVar178 * auVar132._8_4_;
      fVar179 = auVar148._12_4_;
      auVar130._12_4_ = fVar179 * auVar132._12_4_;
      auVar159 = vfmsub231ps_fma(auVar130,auVar143,auVar149);
      auVar130 = vsubps_avx(auVar85,auVar63);
      fVar11 = auVar130._0_4_;
      auVar150._0_4_ = auVar149._0_4_ * fVar11;
      fVar12 = auVar130._4_4_;
      auVar150._4_4_ = auVar149._4_4_ * fVar12;
      fVar13 = auVar130._8_4_;
      auVar150._8_4_ = auVar149._8_4_ * fVar13;
      fVar15 = auVar130._12_4_;
      auVar150._12_4_ = auVar149._12_4_ * fVar15;
      auVar135._0_4_ = auVar85._0_4_ + auVar63._0_4_;
      auVar135._4_4_ = auVar85._4_4_ + auVar63._4_4_;
      auVar135._8_4_ = auVar85._8_4_ + auVar63._8_4_;
      auVar135._12_4_ = auVar85._12_4_ + auVar63._12_4_;
      auVar149 = vfmsub231ps_fma(auVar150,auVar148,auVar135);
      fVar164 = auVar143._0_4_;
      auVar136._0_4_ = fVar164 * auVar135._0_4_;
      fVar169 = auVar143._4_4_;
      auVar136._4_4_ = fVar169 * auVar135._4_4_;
      fVar170 = auVar143._8_4_;
      auVar136._8_4_ = fVar170 * auVar135._8_4_;
      fVar171 = auVar143._12_4_;
      auVar136._12_4_ = fVar171 * auVar135._12_4_;
      auVar46 = vfmsub231ps_fma(auVar136,auVar130,auVar132);
      auVar137._0_4_ = fVar14 * auVar46._0_4_;
      auVar137._4_4_ = fVar16 * auVar46._4_4_;
      auVar137._8_4_ = fVar17 * auVar46._8_4_;
      auVar137._12_4_ = fVar18 * auVar46._12_4_;
      auVar149 = vfmadd231ps_fma(auVar137,auVar77,auVar149);
      auVar159 = vfmadd231ps_fma(auVar149,auVar78,auVar159);
      auVar149 = vsubps_avx(auVar63,auVar166);
      auVar46._0_4_ = auVar166._0_4_ + auVar63._0_4_;
      auVar46._4_4_ = auVar166._4_4_ + auVar63._4_4_;
      auVar46._8_4_ = auVar166._8_4_ + auVar63._8_4_;
      auVar46._12_4_ = auVar166._12_4_ + auVar63._12_4_;
      auVar166 = vsubps_avx(auVar84,auVar157);
      auVar74._0_4_ = auVar84._0_4_ + auVar157._0_4_;
      auVar74._4_4_ = auVar84._4_4_ + auVar157._4_4_;
      auVar74._8_4_ = auVar84._8_4_ + auVar157._8_4_;
      auVar74._12_4_ = auVar84._12_4_ + auVar157._12_4_;
      auVar157 = vsubps_avx(auVar128,auVar45);
      auVar93._0_4_ = auVar128._0_4_ + auVar45._0_4_;
      auVar93._4_4_ = auVar128._4_4_ + auVar45._4_4_;
      auVar93._8_4_ = auVar128._8_4_ + auVar45._8_4_;
      auVar93._12_4_ = auVar128._12_4_ + auVar45._12_4_;
      auVar115._0_4_ = auVar157._0_4_ * auVar74._0_4_;
      auVar115._4_4_ = auVar157._4_4_ * auVar74._4_4_;
      auVar115._8_4_ = auVar157._8_4_ * auVar74._8_4_;
      auVar115._12_4_ = auVar157._12_4_ * auVar74._12_4_;
      auVar84 = vfmsub231ps_fma(auVar115,auVar166,auVar93);
      auVar94._0_4_ = auVar149._0_4_ * auVar93._0_4_;
      auVar94._4_4_ = auVar149._4_4_ * auVar93._4_4_;
      auVar94._8_4_ = auVar149._8_4_ * auVar93._8_4_;
      auVar94._12_4_ = auVar149._12_4_ * auVar93._12_4_;
      auVar63 = vfmsub231ps_fma(auVar94,auVar157,auVar46);
      auVar47._0_4_ = auVar46._0_4_ * auVar166._0_4_;
      auVar47._4_4_ = auVar46._4_4_ * auVar166._4_4_;
      auVar47._8_4_ = auVar46._8_4_ * auVar166._8_4_;
      auVar47._12_4_ = auVar46._12_4_ * auVar166._12_4_;
      auVar128 = vfmsub231ps_fma(auVar47,auVar149,auVar74);
      auVar48._0_4_ = fVar14 * auVar128._0_4_;
      auVar48._4_4_ = fVar16 * auVar128._4_4_;
      auVar48._8_4_ = fVar17 * auVar128._8_4_;
      auVar48._12_4_ = fVar18 * auVar128._12_4_;
      auVar63 = vfmadd231ps_fma(auVar48,auVar77,auVar63);
      auVar45 = vfmadd231ps_fma(auVar63,auVar78,auVar84);
      auVar95._0_4_ = auVar45._0_4_ + auVar154._0_4_ + auVar159._0_4_;
      auVar95._4_4_ = auVar45._4_4_ + auVar154._4_4_ + auVar159._4_4_;
      auVar95._8_4_ = auVar45._8_4_ + auVar154._8_4_ + auVar159._8_4_;
      auVar95._12_4_ = auVar45._12_4_ + auVar154._12_4_ + auVar159._12_4_;
      auVar63 = vminps_avx(auVar154,auVar159);
      auVar84 = vminps_avx(auVar63,auVar45);
      auVar63 = vandps_avx(auVar95,auVar156);
      auVar96._0_4_ = auVar63._0_4_ * 1.1920929e-07;
      auVar96._4_4_ = auVar63._4_4_ * 1.1920929e-07;
      auVar96._8_4_ = auVar63._8_4_ * 1.1920929e-07;
      auVar96._12_4_ = auVar63._12_4_ * 1.1920929e-07;
      auVar112 = ZEXT1664(auVar96);
      uVar19 = CONCAT44(auVar96._4_4_,auVar96._0_4_);
      auVar116._0_8_ = uVar19 ^ 0x8000000080000000;
      auVar116._8_4_ = -auVar96._8_4_;
      auVar116._12_4_ = -auVar96._12_4_;
      auVar84 = vcmpps_avx(auVar84,auVar116,5);
      auVar128 = vmaxps_avx(auVar154,auVar159);
      auVar128 = vmaxps_avx(auVar128,auVar45);
      auVar128 = vcmpps_avx(auVar128,auVar96,2);
      auVar84 = vorps_avx(auVar84,auVar128);
      auVar128 = auVar72 & auVar84;
      if ((((auVar128 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar128 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar128 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar128[0xf]
         ) {
        auVar163 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar49._0_4_ = fVar164 * auVar165._0_4_;
        auVar49._4_4_ = fVar169 * auVar165._4_4_;
        auVar49._8_4_ = fVar170 * auVar165._8_4_;
        auVar49._12_4_ = fVar171 * auVar165._12_4_;
        auVar75._0_4_ = fVar11 * auVar92._0_4_;
        auVar75._4_4_ = fVar12 * auVar92._4_4_;
        auVar75._8_4_ = fVar13 * auVar92._8_4_;
        auVar75._12_4_ = fVar15 * auVar92._12_4_;
        auVar45 = vfmsub213ps_fma(auVar92,auVar148,auVar49);
        auVar97._0_4_ = fVar175 * auVar166._0_4_;
        auVar97._4_4_ = fVar177 * auVar166._4_4_;
        auVar97._8_4_ = fVar178 * auVar166._8_4_;
        auVar97._12_4_ = fVar179 * auVar166._12_4_;
        auVar117._0_4_ = fVar11 * auVar157._0_4_;
        auVar117._4_4_ = fVar12 * auVar157._4_4_;
        auVar117._8_4_ = fVar13 * auVar157._8_4_;
        auVar117._12_4_ = fVar15 * auVar157._12_4_;
        auVar92 = vfmsub213ps_fma(auVar157,auVar143,auVar97);
        auVar128 = vandps_avx(auVar49,auVar156);
        auVar157 = vandps_avx(auVar97,auVar156);
        auVar128 = vcmpps_avx(auVar128,auVar157,1);
        auVar157 = vblendvps_avx(auVar92,auVar45,auVar128);
        auVar50._0_4_ = auVar149._0_4_ * fVar164;
        auVar50._4_4_ = auVar149._4_4_ * fVar169;
        auVar50._8_4_ = auVar149._8_4_ * fVar170;
        auVar50._12_4_ = auVar149._12_4_ * fVar171;
        auVar45 = vfmsub213ps_fma(auVar149,auVar148,auVar117);
        auVar98._0_4_ = fVar175 * auVar51._0_4_;
        auVar98._4_4_ = fVar177 * auVar51._4_4_;
        auVar98._8_4_ = fVar178 * auVar51._8_4_;
        auVar98._12_4_ = fVar179 * auVar51._12_4_;
        auVar92 = vfmsub213ps_fma(auVar165,auVar130,auVar98);
        auVar128 = vandps_avx(auVar98,auVar156);
        auVar148 = vandps_avx(auVar117,auVar156);
        auVar128 = vcmpps_avx(auVar128,auVar148,1);
        auVar45 = vblendvps_avx(auVar45,auVar92,auVar128);
        auVar92 = vfmsub213ps_fma(auVar51,auVar143,auVar75);
        auVar165 = vfmsub213ps_fma(auVar166,auVar130,auVar50);
        auVar128 = vandps_avx(auVar156,auVar75);
        auVar148 = vandps_avx(auVar156,auVar50);
        auVar128 = vcmpps_avx(auVar128,auVar148,1);
        auVar148 = vblendvps_avx(auVar165,auVar92,auVar128);
        local_38c8 = auVar26._0_4_;
        fStack_38c4 = auVar26._4_4_;
        fStack_38c0 = auVar26._8_4_;
        auVar51._0_4_ = auVar148._0_4_ * local_38c8;
        auVar51._4_4_ = auVar148._4_4_ * fStack_38c4;
        auVar51._8_4_ = auVar148._8_4_ * fStack_38c0;
        auVar51._12_4_ = auVar148._12_4_ * fVar18;
        auVar128 = vfmadd213ps_fma(auVar77,auVar45,auVar51);
        auVar128 = vfmadd213ps_fma(auVar78,auVar157,auVar128);
        auVar52._0_4_ = auVar128._0_4_ + auVar128._0_4_;
        auVar52._4_4_ = auVar128._4_4_ + auVar128._4_4_;
        auVar52._8_4_ = auVar128._8_4_ + auVar128._8_4_;
        auVar52._12_4_ = auVar128._12_4_ + auVar128._12_4_;
        auVar76._0_4_ = auVar148._0_4_ * fVar6;
        auVar76._4_4_ = auVar148._4_4_ * fVar7;
        auVar76._8_4_ = auVar148._8_4_ * fVar8;
        auVar76._12_4_ = auVar148._12_4_ * fVar9;
        auVar128 = vfmadd213ps_fma(auVar147,auVar45,auVar76);
        auVar77 = vfmadd213ps_fma(auVar85,auVar157,auVar128);
        auVar128 = vrcpps_avx(auVar52);
        auVar126._8_4_ = 0x3f800000;
        auVar126._0_8_ = 0x3f8000003f800000;
        auVar126._12_4_ = 0x3f800000;
        auVar78 = vfnmadd213ps_fma(auVar128,auVar52,auVar126);
        auVar128 = vfmadd132ps_fma(auVar78,auVar128,auVar128);
        auVar99._0_4_ = (auVar77._0_4_ + auVar77._0_4_) * auVar128._0_4_;
        auVar99._4_4_ = (auVar77._4_4_ + auVar77._4_4_) * auVar128._4_4_;
        auVar99._8_4_ = (auVar77._8_4_ + auVar77._8_4_) * auVar128._8_4_;
        auVar99._12_4_ = (auVar77._12_4_ + auVar77._12_4_) * auVar128._12_4_;
        auVar112 = ZEXT1664(auVar99);
        auVar128 = *(undefined1 (*) [16])(ray + 0x80);
        auVar77 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar99,2);
        auVar78 = vcmpps_avx(auVar99,auVar128,2);
        auVar77 = vandps_avx(auVar77,auVar78);
        uVar19 = CONCAT44(auVar52._4_4_,auVar52._0_4_);
        auVar118._0_8_ = uVar19 ^ 0x8000000080000000;
        auVar118._8_4_ = -auVar52._8_4_;
        auVar118._12_4_ = -auVar52._12_4_;
        auVar78 = vcmpps_avx(auVar52,auVar118,4);
        auVar77 = vandps_avx(auVar78,auVar77);
        auVar84 = vandps_avx(auVar84,auVar72);
        auVar77 = vpslld_avx(auVar77,0x1f);
        auVar78 = vpsrad_avx(auVar77,0x1f);
        auVar77 = auVar84 & auVar78;
        if ((((auVar77 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar77 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar77 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar77[0xf]
           ) {
          auVar163 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar84 = vandps_avx(auVar78,auVar84);
          pGVar4 = (context->scene->geometries).items[uVar31].ptr;
          uVar2 = pGVar4->mask;
          auVar79._4_4_ = uVar2;
          auVar79._0_4_ = uVar2;
          auVar79._8_4_ = uVar2;
          auVar79._12_4_ = uVar2;
          auVar77 = vpand_avx(auVar79,*(undefined1 (*) [16])(ray + 0x90));
          auVar77 = vpcmpeqd_avx(auVar77,_DAT_01f7aa10);
          auVar78 = auVar84 & ~auVar77;
          auVar163 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar78[0xf] < '\0') {
            uVar1 = *(undefined4 *)((long)&local_3708 + uVar37 * 4);
            auVar84 = vandnps_avx(auVar77,auVar84);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar77 = vrcpps_avx(auVar95);
              auVar133._8_4_ = 0x3f800000;
              auVar133._0_8_ = 0x3f8000003f800000;
              auVar133._12_4_ = 0x3f800000;
              auVar78 = vfnmadd213ps_fma(auVar95,auVar77,auVar133);
              auVar77 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
              auVar59._8_4_ = 0x219392ef;
              auVar59._0_8_ = 0x219392ef219392ef;
              auVar59._12_4_ = 0x219392ef;
              auVar63 = vcmpps_avx(auVar63,auVar59,5);
              auVar63 = vandps_avx(auVar63,auVar77);
              auVar124._0_4_ = auVar63._0_4_ * auVar154._0_4_;
              auVar124._4_4_ = auVar63._4_4_ * auVar154._4_4_;
              auVar124._8_4_ = auVar63._8_4_ * auVar154._8_4_;
              auVar124._12_4_ = auVar63._12_4_ * auVar154._12_4_;
              auVar77 = vminps_avx(auVar124,auVar133);
              auVar60._0_4_ = auVar63._0_4_ * auVar159._0_4_;
              auVar60._4_4_ = auVar63._4_4_ * auVar159._4_4_;
              auVar60._8_4_ = auVar63._8_4_ * auVar159._8_4_;
              auVar60._12_4_ = auVar63._12_4_ * auVar159._12_4_;
              auVar63 = vminps_avx(auVar60,auVar133);
              auVar78 = vsubps_avx(auVar133,auVar77);
              auVar85 = vsubps_avx(auVar133,auVar63);
              auVar24._8_8_ = uVar28;
              auVar24._0_8_ = uVar27;
              local_36c8 = vblendvps_avx(auVar77,auVar78,auVar24);
              local_36b8 = vblendvps_avx(auVar63,auVar85,auVar24);
              local_36a8._4_4_ = uVar1;
              local_36a8._0_4_ = uVar1;
              local_36a8._8_4_ = uVar1;
              local_36a8._12_4_ = uVar1;
              local_36f8[0] = (RTCHitN)auVar157[0];
              local_36f8[1] = (RTCHitN)auVar157[1];
              local_36f8[2] = (RTCHitN)auVar157[2];
              local_36f8[3] = (RTCHitN)auVar157[3];
              local_36f8[4] = (RTCHitN)auVar157[4];
              local_36f8[5] = (RTCHitN)auVar157[5];
              local_36f8[6] = (RTCHitN)auVar157[6];
              local_36f8[7] = (RTCHitN)auVar157[7];
              local_36f8[8] = (RTCHitN)auVar157[8];
              local_36f8[9] = (RTCHitN)auVar157[9];
              local_36f8[10] = (RTCHitN)auVar157[10];
              local_36f8[0xb] = (RTCHitN)auVar157[0xb];
              local_36f8[0xc] = (RTCHitN)auVar157[0xc];
              local_36f8[0xd] = (RTCHitN)auVar157[0xd];
              local_36f8[0xe] = (RTCHitN)auVar157[0xe];
              local_36f8[0xf] = (RTCHitN)auVar157[0xf];
              local_36e8 = auVar45;
              local_36d8 = auVar148;
              local_3698 = uVar31;
              uStack_3694 = uVar31;
              uStack_3690 = uVar31;
              uStack_368c = uVar31;
              vpcmpeqd_avx2(ZEXT1632(local_36b8),ZEXT1632(local_36b8));
              uStack_3684 = context->user->instID[0];
              local_3688 = uStack_3684;
              uStack_3680 = uStack_3684;
              uStack_367c = uStack_3684;
              uStack_3678 = context->user->instPrimID[0];
              uStack_3674 = uStack_3678;
              uStack_3670 = uStack_3678;
              uStack_366c = uStack_3678;
              auVar63 = vblendvps_avx(auVar128,auVar99,auVar84);
              *(undefined1 (*) [16])(ray + 0x80) = auVar63;
              args.valid = (int *)local_3858;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = local_36f8;
              args.N = 4;
              local_3858 = auVar84;
              args.ray = (RTCRayN *)ray;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar112 = ZEXT1664(auVar99);
                auVar163._0_8_ = (*pGVar4->occlusionFilterN)(&args);
                auVar163._8_56_ = extraout_var;
                auVar63 = auVar163._0_16_;
                auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar163 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              if (local_3858 == (undefined1  [16])0x0) {
                auVar63 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar63 = auVar63 ^ _DAT_01f7ae20;
              }
              else {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar168._0_8_ = (*p_Var5)(&args);
                  auVar168._8_56_ = extraout_var_00;
                  auVar63 = auVar168._0_16_;
                  auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar163 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                auVar84 = vpcmpeqd_avx(local_3858,_DAT_01f7aa10);
                auVar63 = vpcmpeqd_avx(auVar63,auVar63);
                auVar63 = auVar84 ^ auVar63;
                auVar109._8_4_ = 0xff800000;
                auVar109._0_8_ = 0xff800000ff800000;
                auVar109._12_4_ = 0xff800000;
                auVar112 = ZEXT1664(auVar109);
                auVar84 = vblendvps_avx(auVar109,*(undefined1 (*) [16])(args.ray + 0x80),auVar84);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar84;
              }
              auVar63 = vpslld_avx(auVar63,0x1f);
              auVar84 = vpsrad_avx(auVar63,0x1f);
              auVar63 = vblendvps_avx(auVar128,*(undefined1 (*) [16])local_3840,auVar63);
              *(undefined1 (*) [16])local_3840 = auVar63;
            }
            auVar72 = vpandn_avx(auVar84,auVar72);
          }
        }
      }
      if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar72[0xf])
      break;
      auVar63 = *(undefined1 (*) [16])ray;
      auVar84 = *(undefined1 (*) [16])(ray + 0x10);
      auVar128 = *(undefined1 (*) [16])(ray + 0x20);
      auVar85 = vsubps_avx(local_37e8,auVar63);
      auVar147 = vsubps_avx(local_37f8,auVar84);
      auVar25._4_4_ = uVar32;
      auVar25._0_4_ = uVar32;
      auVar25._8_4_ = uVar32;
      auVar25._12_4_ = uVar32;
      auVar77 = vsubps_avx(auVar25,auVar128);
      auVar78 = vsubps_avx(auVar142,auVar63);
      auVar148 = vsubps_avx(auVar153,auVar84);
      auVar157 = vsubps_avx(auVar158,auVar128);
      auVar45 = vsubps_avx(auVar129,auVar63);
      auVar92 = vsubps_avx(local_3898,auVar84);
      auVar128 = vsubps_avx(auVar176,auVar128);
      auVar165 = vsubps_avx(auVar45,auVar85);
      auVar166 = vsubps_avx(auVar92,auVar147);
      auVar51 = vsubps_avx(auVar128,auVar77);
      auVar144._0_4_ = auVar45._0_4_ + auVar85._0_4_;
      auVar144._4_4_ = auVar45._4_4_ + auVar85._4_4_;
      auVar144._8_4_ = auVar45._8_4_ + auVar85._8_4_;
      auVar144._12_4_ = auVar45._12_4_ + auVar85._12_4_;
      auVar155._0_4_ = auVar147._0_4_ + auVar92._0_4_;
      auVar155._4_4_ = auVar147._4_4_ + auVar92._4_4_;
      auVar155._8_4_ = auVar147._8_4_ + auVar92._8_4_;
      auVar155._12_4_ = auVar147._12_4_ + auVar92._12_4_;
      fVar175 = auVar77._0_4_;
      auVar161._0_4_ = fVar175 + auVar128._0_4_;
      fVar177 = auVar77._4_4_;
      auVar161._4_4_ = fVar177 + auVar128._4_4_;
      fVar178 = auVar77._8_4_;
      auVar161._8_4_ = fVar178 + auVar128._8_4_;
      fVar179 = auVar77._12_4_;
      auVar161._12_4_ = fVar179 + auVar128._12_4_;
      auVar167._0_4_ = auVar155._0_4_ * auVar51._0_4_;
      auVar167._4_4_ = auVar155._4_4_ * auVar51._4_4_;
      auVar167._8_4_ = auVar155._8_4_ * auVar51._8_4_;
      auVar167._12_4_ = auVar155._12_4_ * auVar51._12_4_;
      auVar130 = vfmsub231ps_fma(auVar167,auVar166,auVar161);
      auVar162._0_4_ = auVar161._0_4_ * auVar165._0_4_;
      auVar162._4_4_ = auVar161._4_4_ * auVar165._4_4_;
      auVar162._8_4_ = auVar161._8_4_ * auVar165._8_4_;
      auVar162._12_4_ = auVar161._12_4_ * auVar165._12_4_;
      auVar84 = vfmsub231ps_fma(auVar162,auVar51,auVar144);
      auVar145._0_4_ = auVar144._0_4_ * auVar166._0_4_;
      auVar145._4_4_ = auVar144._4_4_ * auVar166._4_4_;
      auVar145._8_4_ = auVar144._8_4_ * auVar166._8_4_;
      auVar145._12_4_ = auVar144._12_4_ * auVar166._12_4_;
      auVar143 = vfmsub231ps_fma(auVar145,auVar165,auVar155);
      auVar63 = *(undefined1 (*) [16])(ray + 0x60);
      fVar6 = auVar63._0_4_;
      auVar151._0_4_ = auVar143._0_4_ * fVar6;
      fVar9 = auVar63._4_4_;
      auVar151._4_4_ = auVar143._4_4_ * fVar9;
      fVar13 = auVar63._8_4_;
      auVar151._8_4_ = auVar143._8_4_ * fVar13;
      fVar16 = auVar63._12_4_;
      auVar151._12_4_ = auVar143._12_4_ * fVar16;
      auVar63 = *(undefined1 (*) [16])(ray + 0x50);
      auVar143 = vfmadd231ps_fma(auVar151,auVar63,auVar84);
      auVar84 = *(undefined1 (*) [16])(ray + 0x40);
      auVar159 = vfmadd231ps_fma(auVar143,auVar84,auVar130);
      auVar143 = vsubps_avx(auVar147,auVar148);
      auVar130 = vsubps_avx(auVar77,auVar157);
      auVar146._0_4_ = auVar147._0_4_ + auVar148._0_4_;
      auVar146._4_4_ = auVar147._4_4_ + auVar148._4_4_;
      auVar146._8_4_ = auVar147._8_4_ + auVar148._8_4_;
      auVar146._12_4_ = auVar147._12_4_ + auVar148._12_4_;
      auVar100._0_4_ = fVar175 + auVar157._0_4_;
      auVar100._4_4_ = fVar177 + auVar157._4_4_;
      auVar100._8_4_ = fVar178 + auVar157._8_4_;
      auVar100._12_4_ = fVar179 + auVar157._12_4_;
      fVar7 = auVar130._0_4_;
      auVar119._0_4_ = auVar146._0_4_ * fVar7;
      fVar11 = auVar130._4_4_;
      auVar119._4_4_ = auVar146._4_4_ * fVar11;
      fVar15 = auVar130._8_4_;
      auVar119._8_4_ = auVar146._8_4_ * fVar15;
      fVar17 = auVar130._12_4_;
      auVar119._12_4_ = auVar146._12_4_ * fVar17;
      auVar154 = vfmsub231ps_fma(auVar119,auVar143,auVar100);
      auVar149 = vsubps_avx(auVar85,auVar78);
      fVar164 = auVar149._0_4_;
      auVar101._0_4_ = fVar164 * auVar100._0_4_;
      fVar169 = auVar149._4_4_;
      auVar101._4_4_ = fVar169 * auVar100._4_4_;
      fVar170 = auVar149._8_4_;
      auVar101._8_4_ = fVar170 * auVar100._8_4_;
      fVar171 = auVar149._12_4_;
      auVar101._12_4_ = fVar171 * auVar100._12_4_;
      auVar138._0_4_ = auVar85._0_4_ + auVar78._0_4_;
      auVar138._4_4_ = auVar85._4_4_ + auVar78._4_4_;
      auVar138._8_4_ = auVar85._8_4_ + auVar78._8_4_;
      auVar138._12_4_ = auVar85._12_4_ + auVar78._12_4_;
      auVar77 = vfmsub231ps_fma(auVar101,auVar130,auVar138);
      fVar8 = auVar143._0_4_;
      auVar139._0_4_ = auVar138._0_4_ * fVar8;
      fVar12 = auVar143._4_4_;
      auVar139._4_4_ = auVar138._4_4_ * fVar12;
      fVar14 = auVar143._8_4_;
      auVar139._8_4_ = auVar138._8_4_ * fVar14;
      fVar18 = auVar143._12_4_;
      auVar139._12_4_ = auVar138._12_4_ * fVar18;
      auVar46 = vfmsub231ps_fma(auVar139,auVar149,auVar146);
      auVar140._0_4_ = fVar6 * auVar46._0_4_;
      auVar140._4_4_ = fVar9 * auVar46._4_4_;
      auVar140._8_4_ = fVar13 * auVar46._8_4_;
      auVar140._12_4_ = fVar16 * auVar46._12_4_;
      auVar77 = vfmadd231ps_fma(auVar140,auVar63,auVar77);
      auVar46 = vfmadd231ps_fma(auVar77,auVar84,auVar154);
      auVar154 = vsubps_avx(auVar78,auVar45);
      auVar102._0_4_ = auVar78._0_4_ + auVar45._0_4_;
      auVar102._4_4_ = auVar78._4_4_ + auVar45._4_4_;
      auVar102._8_4_ = auVar78._8_4_ + auVar45._8_4_;
      auVar102._12_4_ = auVar78._12_4_ + auVar45._12_4_;
      auVar45 = vsubps_avx(auVar148,auVar92);
      auVar80._0_4_ = auVar148._0_4_ + auVar92._0_4_;
      auVar80._4_4_ = auVar148._4_4_ + auVar92._4_4_;
      auVar80._8_4_ = auVar148._8_4_ + auVar92._8_4_;
      auVar80._12_4_ = auVar148._12_4_ + auVar92._12_4_;
      auVar148 = vsubps_avx(auVar157,auVar128);
      auVar53._0_4_ = auVar157._0_4_ + auVar128._0_4_;
      auVar53._4_4_ = auVar157._4_4_ + auVar128._4_4_;
      auVar53._8_4_ = auVar157._8_4_ + auVar128._8_4_;
      auVar53._12_4_ = auVar157._12_4_ + auVar128._12_4_;
      auVar120._0_4_ = auVar148._0_4_ * auVar80._0_4_;
      auVar120._4_4_ = auVar148._4_4_ * auVar80._4_4_;
      auVar120._8_4_ = auVar148._8_4_ * auVar80._8_4_;
      auVar120._12_4_ = auVar148._12_4_ * auVar80._12_4_;
      auVar77 = vfmsub231ps_fma(auVar120,auVar45,auVar53);
      auVar54._0_4_ = auVar154._0_4_ * auVar53._0_4_;
      auVar54._4_4_ = auVar154._4_4_ * auVar53._4_4_;
      auVar54._8_4_ = auVar154._8_4_ * auVar53._8_4_;
      auVar54._12_4_ = auVar154._12_4_ * auVar53._12_4_;
      auVar128 = vfmsub231ps_fma(auVar54,auVar148,auVar102);
      auVar103._0_4_ = auVar102._0_4_ * auVar45._0_4_;
      auVar103._4_4_ = auVar102._4_4_ * auVar45._4_4_;
      auVar103._8_4_ = auVar102._8_4_ * auVar45._8_4_;
      auVar103._12_4_ = auVar102._12_4_ * auVar45._12_4_;
      auVar78 = vfmsub231ps_fma(auVar103,auVar154,auVar80);
      auVar81._0_4_ = fVar6 * auVar78._0_4_;
      auVar81._4_4_ = fVar9 * auVar78._4_4_;
      auVar81._8_4_ = fVar13 * auVar78._8_4_;
      auVar81._12_4_ = fVar16 * auVar78._12_4_;
      auVar128 = vfmadd231ps_fma(auVar81,auVar63,auVar128);
      auVar157 = vfmadd231ps_fma(auVar128,auVar84,auVar77);
      auVar104._0_4_ = auVar157._0_4_ + auVar159._0_4_ + auVar46._0_4_;
      auVar104._4_4_ = auVar157._4_4_ + auVar159._4_4_ + auVar46._4_4_;
      auVar104._8_4_ = auVar157._8_4_ + auVar159._8_4_ + auVar46._8_4_;
      auVar104._12_4_ = auVar157._12_4_ + auVar159._12_4_ + auVar46._12_4_;
      auVar128 = vminps_avx(auVar159,auVar46);
      auVar77 = vminps_avx(auVar128,auVar157);
      auVar128 = vandps_avx(auVar104,auVar156);
      auVar105._0_4_ = auVar128._0_4_ * 1.1920929e-07;
      auVar105._4_4_ = auVar128._4_4_ * 1.1920929e-07;
      auVar105._8_4_ = auVar128._8_4_ * 1.1920929e-07;
      auVar105._12_4_ = auVar128._12_4_ * 1.1920929e-07;
      auVar112 = ZEXT1664(auVar105);
      uVar19 = CONCAT44(auVar105._4_4_,auVar105._0_4_);
      auVar121._0_8_ = uVar19 ^ 0x8000000080000000;
      auVar121._8_4_ = -auVar105._8_4_;
      auVar121._12_4_ = -auVar105._12_4_;
      auVar77 = vcmpps_avx(auVar77,auVar121,5);
      auVar78 = vmaxps_avx(auVar159,auVar46);
      auVar78 = vmaxps_avx(auVar78,auVar157);
      auVar78 = vcmpps_avx(auVar78,auVar105,2);
      auVar77 = vorps_avx(auVar77,auVar78);
      auVar78 = auVar72 & auVar77;
      if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar78 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar78 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar78[0xf])
      {
LAB_005ac950:
        auVar163 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar55._0_4_ = fVar8 * auVar51._0_4_;
        auVar55._4_4_ = fVar12 * auVar51._4_4_;
        auVar55._8_4_ = fVar14 * auVar51._8_4_;
        auVar55._12_4_ = fVar18 * auVar51._12_4_;
        auVar82._0_4_ = fVar164 * auVar166._0_4_;
        auVar82._4_4_ = fVar169 * auVar166._4_4_;
        auVar82._8_4_ = fVar170 * auVar166._8_4_;
        auVar82._12_4_ = fVar171 * auVar166._12_4_;
        auVar157 = vfmsub213ps_fma(auVar166,auVar130,auVar55);
        auVar106._0_4_ = fVar7 * auVar45._0_4_;
        auVar106._4_4_ = fVar11 * auVar45._4_4_;
        auVar106._8_4_ = fVar15 * auVar45._8_4_;
        auVar106._12_4_ = fVar17 * auVar45._12_4_;
        auVar122._0_4_ = fVar164 * auVar148._0_4_;
        auVar122._4_4_ = fVar169 * auVar148._4_4_;
        auVar122._8_4_ = fVar170 * auVar148._8_4_;
        auVar122._12_4_ = fVar171 * auVar148._12_4_;
        auVar92 = vfmsub213ps_fma(auVar148,auVar143,auVar106);
        auVar78 = vandps_avx(auVar55,auVar156);
        auVar148 = vandps_avx(auVar106,auVar156);
        auVar78 = vcmpps_avx(auVar78,auVar148,1);
        auVar157 = vblendvps_avx(auVar92,auVar157,auVar78);
        auVar56._0_4_ = auVar154._0_4_ * fVar8;
        auVar56._4_4_ = auVar154._4_4_ * fVar12;
        auVar56._8_4_ = auVar154._8_4_ * fVar14;
        auVar56._12_4_ = auVar154._12_4_ * fVar18;
        auVar92 = vfmsub213ps_fma(auVar154,auVar130,auVar122);
        auVar107._0_4_ = fVar7 * auVar165._0_4_;
        auVar107._4_4_ = fVar11 * auVar165._4_4_;
        auVar107._8_4_ = fVar15 * auVar165._8_4_;
        auVar107._12_4_ = fVar17 * auVar165._12_4_;
        auVar166 = vfmsub213ps_fma(auVar51,auVar149,auVar107);
        auVar78 = vandps_avx(auVar107,auVar156);
        auVar148 = vandps_avx(auVar122,auVar156);
        auVar78 = vcmpps_avx(auVar78,auVar148,1);
        auVar92 = vblendvps_avx(auVar92,auVar166,auVar78);
        auVar165 = vfmsub213ps_fma(auVar165,auVar143,auVar82);
        auVar45 = vfmsub213ps_fma(auVar45,auVar149,auVar56);
        auVar78 = vandps_avx(auVar82,auVar156);
        auVar148 = vandps_avx(auVar56,auVar156);
        auVar78 = vcmpps_avx(auVar78,auVar148,1);
        auVar78 = vblendvps_avx(auVar45,auVar165,auVar78);
        auVar57._0_4_ = auVar78._0_4_ * fVar6;
        auVar57._4_4_ = auVar78._4_4_ * fVar9;
        auVar57._8_4_ = auVar78._8_4_ * fVar13;
        auVar57._12_4_ = auVar78._12_4_ * fVar16;
        auVar63 = vfmadd213ps_fma(auVar63,auVar92,auVar57);
        auVar63 = vfmadd213ps_fma(auVar84,auVar157,auVar63);
        auVar58._0_4_ = auVar63._0_4_ + auVar63._0_4_;
        auVar58._4_4_ = auVar63._4_4_ + auVar63._4_4_;
        auVar58._8_4_ = auVar63._8_4_ + auVar63._8_4_;
        auVar58._12_4_ = auVar63._12_4_ + auVar63._12_4_;
        auVar83._0_4_ = auVar78._0_4_ * fVar175;
        auVar83._4_4_ = auVar78._4_4_ * fVar177;
        auVar83._8_4_ = auVar78._8_4_ * fVar178;
        auVar83._12_4_ = auVar78._12_4_ * fVar179;
        auVar63 = vfmadd213ps_fma(auVar147,auVar92,auVar83);
        auVar84 = vfmadd213ps_fma(auVar85,auVar157,auVar63);
        auVar63 = vrcpps_avx(auVar58);
        auVar127._8_4_ = 0x3f800000;
        auVar127._0_8_ = 0x3f8000003f800000;
        auVar127._12_4_ = 0x3f800000;
        auVar85 = vfnmadd213ps_fma(auVar63,auVar58,auVar127);
        auVar63 = vfmadd132ps_fma(auVar85,auVar63,auVar63);
        auVar123._0_4_ = (auVar84._0_4_ + auVar84._0_4_) * auVar63._0_4_;
        auVar123._4_4_ = (auVar84._4_4_ + auVar84._4_4_) * auVar63._4_4_;
        auVar123._8_4_ = (auVar84._8_4_ + auVar84._8_4_) * auVar63._8_4_;
        auVar123._12_4_ = (auVar84._12_4_ + auVar84._12_4_) * auVar63._12_4_;
        auVar63 = *(undefined1 (*) [16])(ray + 0x80);
        auVar84 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar123,2);
        auVar85 = vcmpps_avx(auVar123,auVar63,2);
        auVar84 = vandps_avx(auVar84,auVar85);
        uVar19 = CONCAT44(auVar58._4_4_,auVar58._0_4_);
        auVar108._0_8_ = uVar19 ^ 0x8000000080000000;
        auVar108._8_4_ = -auVar58._8_4_;
        auVar108._12_4_ = -auVar58._12_4_;
        auVar112 = ZEXT1664(auVar108);
        auVar85 = vcmpps_avx(auVar58,auVar108,4);
        auVar84 = vandps_avx(auVar85,auVar84);
        auVar77 = vandps_avx(auVar77,auVar72);
        auVar84 = vpslld_avx(auVar84,0x1f);
        auVar85 = vpsrad_avx(auVar84,0x1f);
        auVar84 = auVar77 & auVar85;
        if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar84 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar84 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar84[0xf]
           ) goto LAB_005ac950;
        auVar84 = vandps_avx(auVar85,auVar77);
        uVar2 = *(uint *)(lVar36 + uVar37 * 4);
        pGVar4 = (context->scene->geometries).items[uVar2].ptr;
        uVar31 = pGVar4->mask;
        auVar86._4_4_ = uVar31;
        auVar86._0_4_ = uVar31;
        auVar86._8_4_ = uVar31;
        auVar86._12_4_ = uVar31;
        auVar77 = vpand_avx(auVar86,*(undefined1 (*) [16])(ray + 0x90));
        auVar77 = vpcmpeqd_avx(auVar77,_DAT_01f7aa10);
        auVar85 = auVar84 & ~auVar77;
        auVar163 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar85[0xf] < '\0') {
          uVar32 = *(undefined4 *)((long)&local_3708 + uVar37 * 4);
          auVar84 = vandnps_avx(auVar77,auVar84);
          auVar112 = ZEXT1664(auVar84);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar77 = vrcpps_avx(auVar104);
            auVar134._8_4_ = 0x3f800000;
            auVar134._0_8_ = 0x3f8000003f800000;
            auVar134._12_4_ = 0x3f800000;
            auVar85 = vfnmadd213ps_fma(auVar104,auVar77,auVar134);
            auVar77 = vfmadd132ps_fma(auVar85,auVar77,auVar77);
            auVar61._8_4_ = 0x219392ef;
            auVar61._0_8_ = 0x219392ef219392ef;
            auVar61._12_4_ = 0x219392ef;
            auVar128 = vcmpps_avx(auVar128,auVar61,5);
            auVar128 = vandps_avx(auVar128,auVar77);
            auVar87._0_4_ = auVar128._0_4_ * auVar159._0_4_;
            auVar87._4_4_ = auVar128._4_4_ * auVar159._4_4_;
            auVar87._8_4_ = auVar128._8_4_ * auVar159._8_4_;
            auVar87._12_4_ = auVar128._12_4_ * auVar159._12_4_;
            auVar77 = vminps_avx(auVar87,auVar134);
            auVar62._0_4_ = auVar128._0_4_ * auVar46._0_4_;
            auVar62._4_4_ = auVar128._4_4_ * auVar46._4_4_;
            auVar62._8_4_ = auVar128._8_4_ * auVar46._8_4_;
            auVar62._12_4_ = auVar128._12_4_ * auVar46._12_4_;
            auVar128 = vminps_avx(auVar62,auVar134);
            auVar85 = vsubps_avx(auVar134,auVar77);
            auVar147 = vsubps_avx(auVar134,auVar128);
            auVar23._8_8_ = uVar30;
            auVar23._0_8_ = uVar29;
            local_36c8 = vblendvps_avx(auVar77,auVar85,auVar23);
            local_36b8 = vblendvps_avx(auVar128,auVar147,auVar23);
            local_36a8._4_4_ = uVar32;
            local_36a8._0_4_ = uVar32;
            local_36a8._8_4_ = uVar32;
            local_36a8._12_4_ = uVar32;
            local_36f8[0] = (RTCHitN)auVar157[0];
            local_36f8[1] = (RTCHitN)auVar157[1];
            local_36f8[2] = (RTCHitN)auVar157[2];
            local_36f8[3] = (RTCHitN)auVar157[3];
            local_36f8[4] = (RTCHitN)auVar157[4];
            local_36f8[5] = (RTCHitN)auVar157[5];
            local_36f8[6] = (RTCHitN)auVar157[6];
            local_36f8[7] = (RTCHitN)auVar157[7];
            local_36f8[8] = (RTCHitN)auVar157[8];
            local_36f8[9] = (RTCHitN)auVar157[9];
            local_36f8[10] = (RTCHitN)auVar157[10];
            local_36f8[0xb] = (RTCHitN)auVar157[0xb];
            local_36f8[0xc] = (RTCHitN)auVar157[0xc];
            local_36f8[0xd] = (RTCHitN)auVar157[0xd];
            local_36f8[0xe] = (RTCHitN)auVar157[0xe];
            local_36f8[0xf] = (RTCHitN)auVar157[0xf];
            local_36e8 = auVar92;
            local_36d8 = auVar78;
            local_3698 = uVar2;
            uStack_3694 = uVar2;
            uStack_3690 = uVar2;
            uStack_368c = uVar2;
            vpcmpeqd_avx2(ZEXT1632(local_36b8),ZEXT1632(local_36b8));
            uStack_3684 = context->user->instID[0];
            local_3688 = uStack_3684;
            uStack_3680 = uStack_3684;
            uStack_367c = uStack_3684;
            uStack_3678 = context->user->instPrimID[0];
            uStack_3674 = uStack_3678;
            uStack_3670 = uStack_3678;
            uStack_366c = uStack_3678;
            auVar128 = vblendvps_avx(auVar63,auVar123,auVar84);
            *(undefined1 (*) [16])(ray + 0x80) = auVar128;
            args.valid = (int *)local_3858;
            args.geometryUserPtr = pGVar4->userPtr;
            args.context = context->user;
            args.hit = local_36f8;
            args.N = 4;
            local_3858 = auVar84;
            args.ray = (RTCRayN *)ray;
            if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar174._0_8_ = (*pGVar4->occlusionFilterN)(&args);
              auVar174._8_56_ = extraout_var_01;
              auVar128 = auVar174._0_16_;
              auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar163 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar112 = ZEXT1664(local_3858);
            }
            auVar113 = auVar112._16_48_;
            auVar84 = auVar112._0_16_;
            if (auVar84 == (undefined1  [16])0x0) {
              auVar84 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
              auVar84 = auVar84 ^ _DAT_01f7ae20;
            }
            else {
              p_Var5 = context->args->filter;
              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                auVar89._0_8_ = (*p_Var5)(&args);
                auVar89._8_56_ = extraout_var_02;
                auVar128 = auVar89._0_16_;
                auVar174 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar168 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar163 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar84 = local_3858;
              }
              auVar77 = vpcmpeqd_avx(auVar84,_DAT_01f7aa10);
              auVar84 = vpcmpeqd_avx(auVar128,auVar128);
              auVar84 = auVar77 ^ auVar84;
              auVar110._8_4_ = 0xff800000;
              auVar110._0_8_ = 0xff800000ff800000;
              auVar110._12_4_ = 0xff800000;
              auVar113 = (undefined1  [48])0x0;
              auVar128 = vblendvps_avx(auVar110,*(undefined1 (*) [16])(args.ray + 0x80),auVar77);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar128;
            }
            auVar84 = vpslld_avx(auVar84,0x1f);
            auVar112._0_16_ = vpsrad_avx(auVar84,0x1f);
            auVar112._16_48_ = auVar113;
            auVar63 = vblendvps_avx(auVar63,*(undefined1 (*) [16])local_3840,auVar84);
            *(undefined1 (*) [16])local_3840 = auVar63;
          }
          auVar72 = vpandn_avx(auVar112._0_16_,auVar72);
        }
      }
      if (((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar72[0xf])
         || (bVar44 = 2 < uVar37, uVar37 = uVar37 + 1, bVar44)) break;
    }
    auVar63 = vandps_avx(auVar72,auVar73);
    auVar73 = auVar73 & auVar72;
    if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar73 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar73 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar73[0xf])
    break;
  }
  auVar72 = vpcmpeqd_avx(auVar112._0_16_,auVar112._0_16_);
  aVar64._0_4_ = auVar63._0_4_ ^ auVar72._0_4_;
  aVar64._4_4_ = auVar63._4_4_ ^ auVar72._4_4_;
  aVar64._8_4_ = auVar63._8_4_ ^ auVar72._8_4_;
  aVar64._12_4_ = auVar63._12_4_ ^ auVar72._12_4_;
LAB_005acac5:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar64);
  auVar72 = auVar72 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar72[0xf])
  goto LAB_005acbd9;
  auVar111._8_4_ = 0xff800000;
  auVar111._0_8_ = 0xff800000ff800000;
  auVar111._12_4_ = 0xff800000;
  auVar112 = ZEXT1664(auVar111);
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar111,
                     (undefined1  [16])terminated.field_0);
  goto LAB_005ab8be;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }